

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::TransRangeSyntax::setChild(TransRangeSyntax *this,size_t index,TokenOrSyntax child)

{
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar1;
  SyntaxNode *pSVar2;
  undefined4 uVar3;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar4;
  TransRepeatRangeSyntax *pTVar5;
  
  ppSVar4 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                      ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child);
  pSVar1 = *ppSVar4;
  if (index == 0) {
    (this->items).super_SyntaxListBase.super_SyntaxNode.previewNode = pSVar1->previewNode;
    uVar3 = *(undefined4 *)&pSVar1->field_0x4;
    pSVar2 = pSVar1->parent;
    (this->items).super_SyntaxListBase.super_SyntaxNode.kind = pSVar1->kind;
    *(undefined4 *)&(this->items).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
    (this->items).super_SyntaxListBase.super_SyntaxNode.parent = pSVar2;
    (this->items).super_SyntaxListBase.childCount = *(size_t *)(pSVar1 + 1);
    pSVar2 = pSVar1[1].previewNode;
    (this->items).elements._M_ptr = (pointer)pSVar1[1].parent;
    (this->items).elements._M_extent._M_extent_value = (size_t)pSVar2;
  }
  else {
    if (pSVar1 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pTVar5 = (TransRepeatRangeSyntax *)0x0;
    }
    else {
      ppSVar4 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pTVar5 = (TransRepeatRangeSyntax *)*ppSVar4;
    }
    this->repeat = pTVar5;
  }
  return;
}

Assistant:

void TransRangeSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: items = child.node()->as<SeparatedSyntaxList<ExpressionSyntax>>(); return;
        case 1: repeat = child.node() ? &child.node()->as<TransRepeatRangeSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}